

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addCenterOfMassProjectionConstraint
          (InverseKinematics *this,string *firstSupportFrame,Polygon *firstSupportPolygon,
          Direction *xAxisOfPlaneInWorld,Direction *yAxisOfPlaneInWorld,
          Position *originOfPlaneInWorld)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::addCenterOfMassProjectionConstraint(const std::string &firstSupportFrame,
                                                                const Polygon &firstSupportPolygon,
                                                                const iDynTree::Direction xAxisOfPlaneInWorld,
                                                                const iDynTree::Direction yAxisOfPlaneInWorld,
                                                                const iDynTree::Position originOfPlaneInWorld)
    {
#ifdef IDYNTREE_USES_IPOPT
        std::vector<std::string> supportFrames;
        std::vector<Polygon> supportPolygons;
        supportFrames.push_back(firstSupportFrame);
        supportPolygons.push_back(firstSupportPolygon);
        return addCenterOfMassProjectionConstraint(supportFrames,supportPolygons,xAxisOfPlaneInWorld,yAxisOfPlaneInWorld,originOfPlaneInWorld);
#else
        return missingIpoptErrorReport();
#endif
    }